

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

String * __thiscall
Rml::EventDispatcher::ToString_abi_cxx11_(String *__return_storage_ptr__,EventDispatcher *this)

{
  bool bVar1;
  const_reference pvVar2;
  reference pEVar3;
  ulong uVar4;
  EventListenerEntry *listener;
  const_iterator __end1;
  const_iterator __begin1;
  Listeners *__range1;
  int count;
  EventId previous_id;
  anon_class_8_1_6971b95b add_to_result;
  EventDispatcher *this_local;
  String *result;
  
  add_to_result.result._7_1_ = 0;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = ::std::vector<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>::empty
                    (&this->listeners);
  if (!bVar1) {
    _count = __return_storage_ptr__;
    pvVar2 = ::std::vector<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>::
             operator[](&this->listeners,0);
    __range1._6_2_ = pvVar2->id;
    __range1._0_4_ = 0;
    __end1 = ::std::vector<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>::begin
                       (&this->listeners);
    listener = (EventListenerEntry *)
               ::std::vector<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>::end
                         (&this->listeners);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Rml::EventListenerEntry_*,_std::vector<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>_>
                                       *)&listener), bVar1) {
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Rml::EventListenerEntry_*,_std::vector<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>_>
               ::operator*(&__end1);
      if (pEVar3->id != __range1._6_2_) {
        ToString::anon_class_8_1_6971b95b::operator()
                  ((anon_class_8_1_6971b95b *)&count,__range1._6_2_,(int)__range1);
        __range1._6_2_ = pEVar3->id;
        __range1._0_4_ = 0;
      }
      __range1._0_4_ = (int)__range1 + 1;
      __gnu_cxx::
      __normal_iterator<const_Rml::EventListenerEntry_*,_std::vector<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>_>
      ::operator++(&__end1);
    }
    if (0 < (int)__range1) {
      ToString::anon_class_8_1_6971b95b::operator()
                ((anon_class_8_1_6971b95b *)&count,__range1._6_2_,(int)__range1);
    }
    uVar4 = ::std::__cxx11::string::size();
    if (2 < uVar4) {
      ::std::__cxx11::string::size();
      ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String EventDispatcher::ToString() const
{
	String result;

	if (listeners.empty())
		return result;

	auto add_to_result = [&result](EventId id, int count) {
		const EventSpecification& specification = EventSpecificationInterface::Get(id);
		result += CreateString("%s (%d), ", specification.type.c_str(), count);
	};

	EventId previous_id = listeners[0].id;
	int count = 0;
	for (const auto& listener : listeners)
	{
		if (listener.id != previous_id)
		{
			add_to_result(previous_id, count);
			previous_id = listener.id;
			count = 0;
		}
		count++;
	}

	if (count > 0)
		add_to_result(previous_id, count);

	if (result.size() > 2)
		result.resize(result.size() - 2);

	return result;
}